

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffpcom(fitsfile *fptr,char *comm,int *status)

{
  size_t sVar1;
  int *in_RDX;
  int *in_RSI;
  char *in_RDI;
  int ii;
  int len;
  char card [81];
  int local_80;
  int local_7c;
  char local_78 [88];
  int *local_20;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  if (*in_RDX < 1) {
    local_20 = in_RDX;
    sVar1 = strlen((char *)in_RSI);
    local_80 = 0;
    for (local_7c = (int)sVar1; 0 < local_7c; local_7c = local_7c + -0x48) {
      strcpy(local_78,"COMMENT ");
      strncat(local_78,(char *)((long)in_RSI + (long)local_80),0x48);
      ffprec((fitsfile *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,in_RSI
            );
      local_80 = local_80 + 0x48;
    }
    iVar2 = *local_20;
  }
  else {
    iVar2 = *in_RDX;
  }
  return iVar2;
}

Assistant:

int ffpcom( fitsfile *fptr,      /* I - FITS file pointer   */
            const char  *comm,   /* I - comment string      */
            int   *status)       /* IO - error status       */
/*
  Write 1 or more COMMENT keywords.  If the comment string is too
  long to fit on a single keyword (72 chars) then it will automatically
  be continued on multiple CONTINUE keywords.
*/
{
    char card[FLEN_CARD];
    int len, ii;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    len = strlen(comm);
    ii = 0;

    for (; len > 0; len -= 72)
    {
        strcpy(card, "COMMENT ");
        strncat(card, &comm[ii], 72);
        ffprec(fptr, card, status);
        ii += 72;
    }

    return(*status);
}